

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O2

QDBusArgument * operator<<(QDBusArgument *arg,QList<QList<QString>_> *list)

{
  QList<QString> *pQVar1;
  long lVar2;
  
  QDBusArgument::beginArray((QMetaType)arg);
  pQVar1 = (list->d).ptr;
  for (lVar2 = (list->d).size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    QDBusArgument::operator<<(arg,(QList_conflict1 *)pQVar1);
    pQVar1 = pQVar1 + 1;
  }
  QDBusArgument::endArray();
  return arg;
}

Assistant:

inline QDBusArgument &operator<<(QDBusArgument &arg, const Container<T> &list)
{
    arg.beginArray(QMetaType::fromType<T>());
    typename Container<T>::const_iterator it = list.begin();
    typename Container<T>::const_iterator end = list.end();
    for ( ; it != end; ++it)
        arg << *it;
    arg.endArray();
    return arg;
}